

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

ssize_t __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  basic_substring<const_char> *this_00;
  pfn_error p_Var2;
  code *pcVar3;
  Location loc;
  Location loc_00;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  error_flags eVar7;
  int iVar8;
  size_t i;
  ssize_t sVar9;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  ssize_t extraout_RAX_04;
  size_t sVar10;
  ssize_t extraout_RAX_05;
  size_t sVar11;
  undefined4 in_register_00000034;
  csubstr *pcVar12;
  char *pcVar13;
  bool explicit_key;
  uint uVar14;
  csubstr cVar15;
  basic_substring<const_char> bVar16;
  csubstr s;
  ro_substr chars;
  char *pcStack_f0;
  size_t local_e8;
  char *pcStack_c8;
  size_t local_c0;
  char msg [133];
  
  pcVar12 = (csubstr *)CONCAT44(in_register_00000034,__fd);
  if (pcVar12->str != (char *)0x0 && pcVar12->len != 0) {
    _write_tag(this,*pcVar12);
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,' ');
  }
  if (((ulong)__buf & 0x300) == 0) {
    if (((ulong)__buf & 0xc0) != 0) {
      iVar8 = basic_substring<const_char>::compare(pcVar12 + 2,"<<",2);
      if (iVar8 != 0) {
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,'*');
      }
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,pcVar12[2]);
      return extraout_RAX_00;
    }
  }
  else {
    if (((ulong)__buf & 0xc0) != 0) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        sVar9 = (*pcVar3)();
        return sVar9;
      }
      msg._24_16_ = (undefined1  [16])
                    to_csubstr(
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                              );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = '\x05';
      msg[9] = 'Z';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      loc.super_LineCol.col = 0;
      loc.super_LineCol.offset = SUB168(ZEXT816(0x5a05) << 0x40,0);
      loc.super_LineCol.line = SUB168(ZEXT816(0x5a05) << 0x40,8);
      loc.name.str = (char *)msg._24_8_;
      loc.name.len = msg._32_8_;
      error("check failed: flags.is_ref() != flags.has_anchor()",0x32,loc);
    }
    if ((pcVar12[2].len == 0) || (pcVar12[2].str == (char *)0x0)) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        sVar9 = (*pcVar3)();
        return sVar9;
      }
      msg._24_16_ = (undefined1  [16])
                    to_csubstr(
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                              );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = '\x06';
      msg[9] = 'Z';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      loc_00.super_LineCol.col = 0;
      loc_00.super_LineCol.offset = SUB168(ZEXT816(0x5a06) << 0x40,0);
      loc_00.super_LineCol.line = SUB168(ZEXT816(0x5a06) << 0x40,8);
      loc_00.name.str = (char *)msg._24_8_;
      loc_00.name.len = msg._32_8_;
      error("check failed: ! sc.anchor.empty()",0x21,loc_00);
    }
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,'&');
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,pcVar12[2]);
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,' ');
  }
  uVar14 = (uint)__buf;
  if ((((ulong)__buf & 0x7fe0000) != 0) &&
     ((((ulong)__buf & 0x2aa0000) == 0) != (((ulong)__buf & 0x5540000) != 0))) {
    memcpy(msg,
           "check failed: (((flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE)) == 0) || (((flags&_WIP_KEY_STYLE) == 0) != ((flags&_WIP_VAL_STYLE) == 0)))"
           ,0x85);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      sVar9 = (*pcVar3)();
      return sVar9;
    }
    p_Var2 = (this->m_tree->m_callbacks).m_error;
    cVar15 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_c0 = cVar15.len;
    pcStack_c8 = cVar15.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5a14) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x5a14) << 0x40,8);
    LVar4.name.str = pcStack_c8;
    LVar4.name.len = local_c0;
    (*p_Var2)(msg,0x85,LVar4,(this->m_tree->m_callbacks).m_user_data);
  }
  if (((ulong)__buf & 0x60000) != 0) {
    pcVar13 = pcVar12[1].str;
    sVar11 = pcVar12[1].len;
    explicit_key = SUB41((uVar14 & 2) >> 1,0);
    bVar6 = false;
    goto LAB_0019abd5;
  }
  if (((ulong)__buf & 0x180000) != 0) {
    _write_scalar_folded(this,pcVar12[1],__n,SUB41((uVar14 & 2) >> 1,0));
    return extraout_RAX_01;
  }
  if (((ulong)__buf & 0x600000) != 0) {
    _write_scalar_squo(this,pcVar12[1],__n);
    return extraout_RAX_02;
  }
  if (((ulong)__buf & 0x1800000) != 0) {
    _write_scalar_dquo(this,pcVar12[1],__n);
    return extraout_RAX_03;
  }
  if (((ulong)__buf & 0x6000000) != 0) {
    _write_scalar_plain(this,pcVar12[1],__n);
    return extraout_RAX_04;
  }
  if (((ulong)__buf & 0x7fe0000) != 0) {
    builtin_strncpy(msg,"not implemented",0x10);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      sVar9 = (*pcVar3)();
      return sVar9;
    }
    p_Var2 = (this->m_tree->m_callbacks).m_error;
    cVar15 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_e8 = cVar15.len;
    pcStack_f0 = cVar15.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x5a47) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x5a47) << 0x40,8);
    LVar5.name.str = pcStack_f0;
    LVar5.name.len = local_e8;
    sVar9 = (*p_Var2)(msg,0x10,LVar5,(this->m_tree->m_callbacks).m_user_data);
    return sVar9;
  }
  this_00 = pcVar12 + 1;
  bVar6 = false;
  sVar10 = basic_substring<const_char>::first_not_of(this_00,'\n',0);
  if (sVar10 != 0xffffffffffffffff) {
    if (pcVar12[1].len < sVar10) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        sVar9 = (*pcVar3)();
        return sVar9;
      }
      handle_error(0x1ea013,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)msg,this_00->str + sVar10,pcVar12[1].len - sVar10);
    chars.len = 2;
    chars.str = " \t";
    bVar6 = basic_substring<const_char>::begins_with_any((basic_substring<const_char> *)msg,chars);
  }
  pcVar13 = pcVar12[1].str;
  sVar11 = pcVar12[1].len;
  if (bVar6 == true && ((pcVar13 == (char *)0x0 || sVar11 == 0) || sVar10 != 0xffffffffffffffff)) {
    bVar16 = basic_substring<const_char>::trim(this_00,' ');
    pcVar13 = pcVar12[1].str;
    sVar11 = pcVar12[1].len;
    if (bVar16.len == 0 || bVar16.str == (char *)0x0) goto LAB_0019ae2c;
  }
  else if ((pcVar13 == (char *)0x0 || sVar11 == 0) || sVar10 != 0xffffffffffffffff) {
LAB_0019ae2c:
    sVar10 = 0;
    do {
      if (sVar11 == sVar10) {
        cVar15.len = sVar11;
        cVar15.str = pcVar13;
        _write_scalar(this,cVar15,(~uVar14 & 0x1001) == 0 || (~uVar14 & 0x2002) == 0);
        return extraout_RAX_05;
      }
      pcVar1 = pcVar13 + sVar10;
      sVar10 = sVar10 + 1;
    } while (*pcVar1 != '\n');
  }
  explicit_key = SUB41((uVar14 & 2) >> 1,0);
LAB_0019abd5:
  s.len = sVar11;
  s.str = pcVar13;
  _write_scalar_literal(this,s,__n,explicit_key,bVar6);
  return extraout_RAX;
}

Assistant:

void Emitter<Writer>::_write(NodeScalar const& C4_RESTRICT sc, NodeType flags, size_t ilevel)
{
    if( ! sc.tag.empty())
    {
        _write_tag(sc.tag);
        this->Writer::_do_write(' ');
    }
    if(flags.has_anchor())
    {
        RYML_ASSERT(flags.is_ref() != flags.has_anchor());
        RYML_ASSERT( ! sc.anchor.empty());
        this->Writer::_do_write('&');
        this->Writer::_do_write(sc.anchor);
        this->Writer::_do_write(' ');
    }
    else if(flags.is_ref())
    {
        if(sc.anchor != "<<")
            this->Writer::_do_write('*');
        this->Writer::_do_write(sc.anchor);
        return;
    }

    // ensure the style flags only have one of KEY or VAL
    _RYML_CB_ASSERT(m_tree->callbacks(), ((flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE)) == 0) || (((flags&_WIP_KEY_STYLE) == 0) != ((flags&_WIP_VAL_STYLE) == 0)));

    auto style_marks = flags & (_WIP_KEY_STYLE|_WIP_VAL_STYLE);
    if(style_marks & (_WIP_KEY_LITERAL|_WIP_VAL_LITERAL))
    {
        _write_scalar_literal(sc.scalar, ilevel, flags.has_key());
    }
    else if(style_marks & (_WIP_KEY_FOLDED|_WIP_VAL_FOLDED))
    {
        _write_scalar_folded(sc.scalar, ilevel, flags.has_key());
    }
    else if(style_marks & (_WIP_KEY_SQUO|_WIP_VAL_SQUO))
    {
        _write_scalar_squo(sc.scalar, ilevel);
    }
    else if(style_marks & (_WIP_KEY_DQUO|_WIP_VAL_DQUO))
    {
        _write_scalar_dquo(sc.scalar, ilevel);
    }
    else if(style_marks & (_WIP_KEY_PLAIN|_WIP_VAL_PLAIN))
    {
        _write_scalar_plain(sc.scalar, ilevel);
    }
    else if(!style_marks)
    {
        size_t first_non_nl = sc.scalar.first_not_of('\n');
        bool all_newlines = first_non_nl == npos;
        bool has_leading_ws = (!all_newlines) && sc.scalar.sub(first_non_nl).begins_with_any(" \t");
        bool do_literal = ((!sc.scalar.empty() && all_newlines) || (has_leading_ws && !sc.scalar.trim(' ').empty()));
        if(do_literal)
        {
            _write_scalar_literal(sc.scalar, ilevel, flags.has_key(), /*explicit_indentation*/has_leading_ws);
        }
        else
        {
            for(size_t i = 0; i < sc.scalar.len; ++i)
            {
                if(sc.scalar.str[i] == '\n')
                {
                    _write_scalar_literal(sc.scalar, ilevel, flags.has_key(), /*explicit_indentation*/has_leading_ws);
                    goto wrote_special;
                }
                // todo: check for escaped characters requiring double quotes
            }
            _write_scalar(sc.scalar, flags.is_quoted());
        wrote_special:
            ;
        }
    }
    else
    {
        _RYML_CB_ERR(m_tree->callbacks(), "not implemented");
    }
}